

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_comparison.cpp
# Opt level: O2

bool duckdb::AreMatchesPossible(LogicalType *left,LogicalType *right)

{
  ulong uVar1;
  idx_t iVar2;
  idx_t iVar3;
  Vector *pVVar4;
  ulong uVar5;
  int64_t iVar6;
  string_t *this;
  LogicalType *type;
  string key;
  string_t local_60;
  string local_50;
  
  iVar2 = EnumType::GetSize(left);
  iVar3 = EnumType::GetSize(right);
  type = right;
  if (iVar2 < iVar3) {
    type = left;
    left = right;
  }
  pVVar4 = EnumType::GetValuesInsertOrder(type);
  this = (string_t *)pVVar4->data;
  iVar2 = EnumType::GetSize(type);
  uVar1 = 0;
  do {
    uVar5 = uVar1;
    if (iVar2 == uVar5) break;
    string_t::GetString_abi_cxx11_(&local_50,this);
    string_t::string_t(&local_60,&local_50);
    iVar6 = EnumType::GetPos(left,&local_60);
    ::std::__cxx11::string::~string((string *)&local_50);
    this = this + 1;
    uVar1 = uVar5 + 1;
  } while (iVar6 == -1);
  return uVar5 < iVar2;
}

Assistant:

bool AreMatchesPossible(LogicalType &left, LogicalType &right) {
	LogicalType *small_enum, *big_enum;
	if (EnumType::GetSize(left) < EnumType::GetSize(right)) {
		small_enum = &left;
		big_enum = &right;
	} else {
		small_enum = &right;
		big_enum = &left;
	}
	auto &string_vec = EnumType::GetValuesInsertOrder(*small_enum);
	auto string_vec_ptr = FlatVector::GetData<string_t>(string_vec);
	auto size = EnumType::GetSize(*small_enum);
	for (idx_t i = 0; i < size; i++) {
		auto key = string_vec_ptr[i].GetString();
		if (EnumType::GetPos(*big_enum, key) != -1) {
			return true;
		}
	}
	return false;
}